

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void player_generate(player *p,player_race *r,player_class *c,_Bool old_history)

{
  short sVar1;
  int32_t iVar2;
  level_map_conflict *map;
  char *pcVar3;
  char *pcVar4;
  level_conflict *plVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if (c == (player_class *)0x0) {
    c = p->class;
  }
  if (r == (player_race *)0x0) {
    r = p->race;
  }
  p->class = c;
  p->race = r;
  map = world;
  if (world == (level_map_conflict *)0x0) {
    p->exp = 0;
    p->max_lev = 1;
    p->lev = 1;
    p->max_exp = 0;
    goto LAB_001a89eb;
  }
  lVar8 = (long)r->start_lev;
  pcVar4 = world->name;
  if (lVar8 == 1) {
LAB_001a896e:
    p->max_exp = 0;
    p->exp = 0;
    lVar8 = 1;
  }
  else {
    pcVar3 = strstr(pcVar4,"Dungeon");
    if ((pcVar3 != (char *)0x0) || ((player->opts).opt[0x2b] != false)) goto LAB_001a896e;
    iVar2 = *(int32_t *)("You have discovered a trap on the chest!" + lVar8 * 4 + 0x25);
    p->exp = iVar2;
    p->max_exp = iVar2;
  }
  p->lev = (int16_t)lVar8;
  p->max_lev = (int16_t)lVar8;
  pcVar4 = strstr(pcVar4,"Dungeon");
  if (pcVar4 == (char *)0x0) {
    if ((player->opts).opt[0x2b] == true) {
      p->home = 0;
    }
    else {
      plVar5 = level_by_name(map,r->hometown);
      p->home = (int16_t)plVar5->index;
    }
  }
  else {
    p->home = 1;
    pcVar4 = option_name(0x2b);
    option_set(pcVar4,0);
  }
LAB_001a89eb:
  uVar6 = p->class->c_mhp + p->race->r_mhp;
  p->hitdie = (uint8_t)uVar6;
  uVar6 = uVar6 & 0xff;
  p->player_hp[0] = (int16_t)uVar6;
  sVar1 = p->lev;
  uVar7 = uVar6;
  for (lVar8 = 0xa0; uVar7 = uVar7 + uVar6, lVar8 + -0x9f < (long)sVar1; lVar8 = lVar8 + 1) {
    p->recall[lVar8 + -0x19] = (int16_t)uVar7;
  }
  p->mhp = p->player_hp[(long)sVar1 + -1];
  get_ahw(p);
  p->timed[10] = (short)PY_FOOD_FULL + -1;
  if (!old_history) {
    if (p->history != (char *)0x0) {
      string_free(p->history);
    }
    pcVar4 = get_history(p->race->history);
    p->history = pcVar4;
  }
  return;
}

Assistant:

void player_generate(struct player *p, const struct player_race *r,
					 const struct player_class *c, bool old_history)
{
	int i;

	if (!c)
		c = p->class;
	if (!r)
		r = p->race;

	p->class = c;
	p->race = r;

	/* Set the level */
	get_level(p);

	/* Hitdice */
	p->hitdie = p->race->r_mhp + p->class->c_mhp;

	/* Pre-calculate level 1 hitdice */
	p->player_hp[0] = p->hitdie;

	/*
	 * Fill in overestimates of hitpoints for additional levels.  Do not
	 * do the actual rolls so the player can not reset the birth screen
	 * to get a desirable set of initial rolls.
	 */
	for (i = 1; i < p->lev; i++) {
		p->player_hp[i] = p->player_hp[i - 1] + p->hitdie;
	}

	/* Initial hitpoints */
	p->mhp = p->player_hp[p->lev - 1];

	/* Roll for age/height/weight */
	get_ahw(p);

	/* Always start with a well fed player */
	p->timed[TMD_FOOD] = PY_FOOD_FULL - 1;

	if (!old_history) {
		if (p->history) {
			string_free(p->history);
		}
		p->history = get_history(p->race->history);
	}
}